

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O1

void Abc_NtkToBarBufsCollect_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  void **ppvVar5;
  int in_EDX;
  int Fill;
  int iVar6;
  long lVar7;
  
  pAVar3 = pObj->pNtk;
  iVar6 = pObj->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar6 + 1,in_EDX);
  if (((long)iVar6 < 0) || ((pAVar3->vTravIds).nSize <= iVar6)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar4 = pObj->pNtk;
  iVar1 = pAVar4->nTravIds;
  if ((pAVar3->vTravIds).pArray[iVar6] == iVar1) {
    return;
  }
  iVar6 = pObj->Id;
  Vec_IntFillExtra(&pAVar4->vTravIds,iVar6 + 1,Fill);
  if (((long)iVar6 < 0) || ((pAVar4->vTravIds).nSize <= iVar6)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  (pAVar4->vTravIds).pArray[iVar6] = iVar1;
  if ((*(uint *)&pObj->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x15b,"void Abc_NtkToBarBufsCollect_rec(Abc_Obj_t *, Vec_Ptr_t *)");
  }
  if (0 < (pObj->vFanins).nSize) {
    lVar7 = 0;
    do {
      Abc_NtkToBarBufsCollect_rec
                ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar7]],vNodes);
      lVar7 = lVar7 + 1;
    } while (lVar7 < (pObj->vFanins).nSize);
  }
  uVar2 = vNodes->nCap;
  if (vNodes->nSize == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (vNodes->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(vNodes->pArray,0x80);
      }
      vNodes->pArray = ppvVar5;
      iVar6 = 0x10;
    }
    else {
      iVar6 = uVar2 * 2;
      if (iVar6 <= (int)uVar2) goto LAB_00844033;
      if (vNodes->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(vNodes->pArray,(ulong)uVar2 << 4);
      }
      vNodes->pArray = ppvVar5;
    }
    vNodes->nCap = iVar6;
  }
LAB_00844033:
  iVar6 = vNodes->nSize;
  vNodes->nSize = iVar6 + 1;
  vNodes->pArray[iVar6] = pObj;
  return;
}

Assistant:

void Abc_NtkToBarBufsCollect_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pFanin; 
    int i;
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    assert( Abc_ObjIsNode(pObj) );
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Abc_NtkToBarBufsCollect_rec( pFanin, vNodes );
    Vec_PtrPush( vNodes, pObj );
}